

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_update_texture
               (uint id,int width,int height,rf_pixel_format format,void *pixels,int pixels_size)

{
  _Bool _Var1;
  int iVar2;
  rf_gfx_pixel_format rVar3;
  uint local_3c;
  rf_gfx_pixel_format gfx_format;
  int pixels_size_local;
  void *pixels_local;
  rf_pixel_format format_local;
  int height_local;
  int width_local;
  uint id_local;
  
  iVar2 = rf_bytes_per_pixel(format);
  if (pixels_size < width * height * iVar2) {
    (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,id);
    rVar3 = rf_gfx_get_internal_texture_formats(format);
    if ((((undefined1  [16])rVar3 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) ||
       (_Var1 = rf_is_uncompressed_format(format), !_Var1)) {
      rf_log_impl(4,0x1b4033);
    }
    else {
      local_3c = rVar3.internal_format;
      gfx_format.internal_format = rVar3.type;
      (*(rf__ctx->field_0).gfx_ctx.gl.TexSubImage2D)
                (0xde1,0,0,0,width,height,local_3c,gfx_format.internal_format,pixels);
    }
  }
  return;
}

Assistant:

RF_API void rf_gfx_update_texture(unsigned int id, int width, int height, rf_pixel_format format, const void* pixels, int pixels_size)
{
    if (width * height * rf_bytes_per_pixel(format) <= pixels_size) return;

    rf_gl.BindTexture(GL_TEXTURE_2D, id);

    rf_gfx_pixel_format gfx_format = rf_gfx_get_internal_texture_formats(format);

    if (gfx_format.valid && rf_is_uncompressed_format(format))
    {
        rf_gl.TexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, width, height, gfx_format.internal_format, gfx_format.type, (unsigned char*) pixels);
    }
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_texture format updating not supported");
}